

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

void __thiscall
ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
          (ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *this,
          vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *list)

{
  pointer ppEVar1;
  pointer ppEVar2;
  long lVar3;
  ulong size;
  
  ppEVar1 = (list->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppEVar2 = (list->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  size = (long)ppEVar2 - (long)ppEVar1 >> 3;
  if (*(ulong *)(this + 0x10) < size) {
    ArenaVector<wasm::Expression_*>::allocate((ArenaVector<wasm::Expression_*> *)this,size);
    ppEVar1 = (list->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    ppEVar2 = (list->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
  }
  for (lVar3 = 0; (pointer)((long)ppEVar1 + lVar3) != ppEVar2; lVar3 = lVar3 + 8) {
    *(Expression **)(*(long *)this + lVar3) = *(pointer)((long)ppEVar1 + lVar3);
  }
  *(ulong *)(this + 8) = size;
  return;
}

Assistant:

void set(const ListType& list) {
    size_t size = list.size();
    if (allocatedElements < size) {
      static_cast<SubType*>(this)->allocate(size);
    }
    size_t i = 0;
    for (auto elem : list) {
      data[i++] = elem;
    }
    usedElements = size;
  }